

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.h
# Opt level: O1

void __thiscall ReaderData::~ReaderData(ReaderData *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_ReaderData = (_func_int **)&PTR__ReaderData_0023fee0;
  if (this->m_nextBlock[0] != (uint8_t *)0x0) {
    operator_delete__(this->m_nextBlock[0]);
  }
  if (this->m_nextBlock[1] != (uint8_t *)0x0) {
    operator_delete__(this->m_nextBlock[1]);
  }
  pcVar1 = (this->m_streamName)._M_dataplus._M_p;
  paVar2 = &(this->m_streamName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~ReaderData()
    {
        // deleteNextBlocks();
        delete[] m_nextBlock[0];
        delete[] m_nextBlock[1];
    }